

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walMerge(u32 *aContent,ht_slot *aLeft,int nLeft,ht_slot **paRight,int *pnRight,ht_slot *aTmp)

{
  int iVar1;
  u32 uVar2;
  ht_slot *phVar3;
  int iVar4;
  ushort local_52;
  Pgno dbpage;
  ht_slot logpage;
  ht_slot *aRight;
  int nRight;
  int iOut;
  int iRight;
  int iLeft;
  ht_slot *aTmp_local;
  int *pnRight_local;
  ht_slot **paRight_local;
  int nLeft_local;
  ht_slot *aLeft_local;
  u32 *aContent_local;
  
  iOut = 0;
  nRight = 0;
  aRight._4_4_ = 0;
  iVar1 = *pnRight;
  phVar3 = *paRight;
  while (nRight < iVar1 || iOut < nLeft) {
    if ((iOut < nLeft) && ((iVar1 <= nRight || (aContent[aLeft[iOut]] < aContent[phVar3[nRight]]))))
    {
      local_52 = aLeft[iOut];
      iOut = iOut + 1;
    }
    else {
      local_52 = phVar3[nRight];
      nRight = nRight + 1;
    }
    uVar2 = aContent[local_52];
    iVar4 = aRight._4_4_ + 1;
    aTmp[aRight._4_4_] = local_52;
    aRight._4_4_ = iVar4;
    if ((iOut < nLeft) && (aContent[aLeft[iOut]] == uVar2)) {
      iOut = iOut + 1;
    }
  }
  *paRight = aLeft;
  *pnRight = aRight._4_4_;
  memcpy(aLeft,aTmp,(long)aRight._4_4_ << 1);
  return;
}

Assistant:

static void walMerge(
  const u32 *aContent,            /* Pages in wal - keys for the sort */
  ht_slot *aLeft,                 /* IN: Left hand input list */
  int nLeft,                      /* IN: Elements in array *paLeft */
  ht_slot **paRight,              /* IN/OUT: Right hand input list */
  int *pnRight,                   /* IN/OUT: Elements in *paRight */
  ht_slot *aTmp                   /* Temporary buffer */
){
  int iLeft = 0;                  /* Current index in aLeft */
  int iRight = 0;                 /* Current index in aRight */
  int iOut = 0;                   /* Current index in output buffer */
  int nRight = *pnRight;
  ht_slot *aRight = *paRight;

  assert( nLeft>0 && nRight>0 );
  while( iRight<nRight || iLeft<nLeft ){
    ht_slot logpage;
    Pgno dbpage;

    if( (iLeft<nLeft)
     && (iRight>=nRight || aContent[aLeft[iLeft]]<aContent[aRight[iRight]])
    ){
      logpage = aLeft[iLeft++];
    }else{
      logpage = aRight[iRight++];
    }
    dbpage = aContent[logpage];

    aTmp[iOut++] = logpage;
    if( iLeft<nLeft && aContent[aLeft[iLeft]]==dbpage ) iLeft++;

    assert( iLeft>=nLeft || aContent[aLeft[iLeft]]>dbpage );
    assert( iRight>=nRight || aContent[aRight[iRight]]>dbpage );
  }

  *paRight = aLeft;
  *pnRight = iOut;
  memcpy(aLeft, aTmp, sizeof(aTmp[0])*iOut);
}